

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O0

int ON_FindLocalMinimum(_func_int_void_ptr_double_double_ptr_double_ptr *f,void *farg,double ax,
                       double bx,double cx,double rel_stepsize_tol,double abs_stepsize_tol,
                       int max_it,double *t_addr)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  bool local_13a;
  bool local_139;
  double local_138;
  double local_130;
  double xm;
  double x;
  double w;
  double v;
  double u2;
  double u1;
  double u;
  double tol2;
  double tol1;
  double olde;
  double fx;
  double fw;
  double fv;
  double fu;
  double e;
  double dx;
  double dw;
  double dv;
  double du;
  double d2;
  double d1;
  double d;
  double b;
  double a;
  uint local_60;
  int ok2;
  int ok1;
  int rc;
  double *t_addr_local;
  double dStack_48;
  int max_it_local;
  double abs_stepsize_tol_local;
  double rel_stepsize_tol_local;
  double cx_local;
  double bx_local;
  double ax_local;
  void *farg_local;
  _func_int_void_ptr_double_double_ptr_double_ptr *f_local;
  
  fu = 0.0;
  d1 = 0.0;
  _ok1 = t_addr;
  t_addr_local._4_4_ = max_it;
  dStack_48 = abs_stepsize_tol;
  abs_stepsize_tol_local = rel_stepsize_tol;
  rel_stepsize_tol_local = cx;
  cx_local = bx;
  bx_local = ax;
  ax_local = (double)farg;
  farg_local = f;
  if (t_addr == (double *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
               ,0x4d,"","t_addr is nullptr");
    f_local._4_4_ = 0;
  }
  else {
    *t_addr = bx;
    if (max_it < 2) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                 ,0x55,"","max_it must be >= 2");
      f_local._4_4_ = 0;
    }
    else {
      bVar2 = ON_IsValid(rel_stepsize_tol);
      if (((!bVar2) || (abs_stepsize_tol_local <= 0.0)) || (1.0 <= abs_stepsize_tol_local)) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                   ,0x5a,"","rel_stepsize_tol must be strictly between 0.0 and 1.0");
        f_local._4_4_ = 0;
      }
      else {
        bVar2 = ON_IsValid(dStack_48);
        dVar1 = cx_local;
        if ((!bVar2) || (dStack_48 <= 0.0)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                     ,0x5f,"","abs_stepsize_tol must be > 0");
          f_local._4_4_ = 0;
        }
        else {
          if (rel_stepsize_tol_local <= bx_local) {
            local_130 = rel_stepsize_tol_local;
          }
          else {
            local_130 = bx_local;
          }
          b = local_130;
          if (bx_local <= rel_stepsize_tol_local) {
            local_138 = rel_stepsize_tol_local;
          }
          else {
            local_138 = bx_local;
          }
          d = local_138;
          w = cx_local;
          x = cx_local;
          xm = cx_local;
          ok2 = (*(code *)farg_local)(cx_local,ax_local,&olde,&e);
          if (ok2 == 0) {
            fw = olde;
            fx = olde;
            dw = e;
            dx = e;
            ok2 = 0;
            while (dVar1 = fu, iVar3 = t_addr_local._4_4_ + -1, t_addr_local._4_4_ != 0) {
              dVar4 = (b + d) * 0.5;
              local_170 = abs_stepsize_tol_local * ABS(xm) + dStack_48;
              dVar5 = local_170 * 2.0;
              if (ABS(xm - dVar4) <= (d - b) * -0.5 + dVar5) {
                *_ok1 = xm;
                return 1;
              }
              if (ABS(fu) <= local_170) {
                local_168 = d;
                if (0.0 <= e) {
                  local_168 = b;
                }
                local_168 = local_168 - xm;
                fu = local_168;
                d1 = local_168 * 0.5;
              }
              else {
                du = (d - b) * 2.0;
                if ((dx != e) || (d2 = du, NAN(dx) || NAN(e))) {
                  d2 = ((x - xm) * e) / (e - dx);
                }
                if ((dw != e) || (NAN(dw) || NAN(e))) {
                  du = ((w - xm) * e) / (e - dw);
                }
                local_139 = 0.0 < (b - (xm + d2)) * ((xm + d2) - d) && e * d2 <= 0.0;
                local_60 = (uint)local_139;
                local_13a = 0.0 < (b - (xm + du)) * ((xm + du) - d) && e * du <= 0.0;
                a._4_4_ = (uint)local_13a;
                fu = d1;
                if ((local_60 == 0) && (a._4_4_ == 0)) {
                  local_160 = d;
                  if (0.0 <= e) {
                    local_160 = b;
                  }
                  local_160 = local_160 - xm;
                  fu = local_160;
                  d1 = local_160 * 0.5;
                }
                else {
                  if ((local_60 == 0) || (a._4_4_ == 0)) {
                    if (local_60 == 0) {
                      d1 = du;
                    }
                    else {
                      d1 = d2;
                    }
                  }
                  else {
                    if (ABS(du) <= ABS(d2)) {
                      local_148 = du;
                    }
                    else {
                      local_148 = d2;
                    }
                    d1 = local_148;
                  }
                  if (ABS(dVar1 * 0.5) < ABS(d1)) {
                    local_158 = d;
                    if (0.0 <= e) {
                      local_158 = b;
                    }
                    local_158 = local_158 - xm;
                    fu = local_158;
                    d1 = local_158 * 0.5;
                  }
                  else if (((xm + d1) - b < dVar5) || (d - (xm + d1) < dVar5)) {
                    local_150 = local_170;
                    if (dVar4 < xm) {
                      local_150 = -local_170;
                    }
                    d1 = local_150;
                  }
                }
              }
              if (ABS(d1) < local_170) {
                if (d1 < 0.0) {
                  local_170 = xm - local_170;
                }
                else {
                  local_170 = xm + local_170;
                }
                u1 = local_170;
                t_addr_local._4_4_ = iVar3;
                ok2 = (*(code *)farg_local)(local_170,ax_local,&fv,&dv);
                if ((-1 < ok2) && (olde < fv)) {
                  *_ok1 = xm;
                  return 1;
                }
              }
              else {
                u1 = xm + d1;
                t_addr_local._4_4_ = iVar3;
                ok2 = (*(code *)farg_local)(u1,ax_local,&fv,&dv);
              }
              if (ok2 != 0) {
                if (ok2 < 0) {
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                             ,0xa9,"","ON_FindLocalMinimum() f() failed to evaluate.");
                }
                else {
                  if (olde <= fv) {
                    local_178 = xm;
                  }
                  else {
                    local_178 = u1;
                  }
                  *_ok1 = local_178;
                }
                return (uint)(0 < ok2);
              }
              if (olde < fv) {
                if (xm <= u1) {
                  d = u1;
                }
                else {
                  b = u1;
                }
                if (fx < fv) {
                  if ((x == xm) && (!NAN(x) && !NAN(xm))) goto LAB_007b5d48;
                  if (fv < fw) goto LAB_007b5dea;
                  if ((w == xm) && (!NAN(w) && !NAN(xm))) goto LAB_007b5dea;
                  if ((w == x) && (!NAN(w) && !NAN(x))) {
LAB_007b5dea:
                    w = u1;
                    fw = fv;
                    dw = dv;
                  }
                }
                else {
LAB_007b5d48:
                  w = x;
                  fw = fx;
                  dw = dx;
                  x = u1;
                  fx = fv;
                  dx = dv;
                }
              }
              else {
                if (u1 < xm) {
                  d = xm;
                }
                else {
                  b = xm;
                }
                w = x;
                fw = fx;
                dw = dx;
                x = xm;
                fx = olde;
                dx = e;
                xm = u1;
                olde = fv;
                e = dv;
              }
            }
            *_ok1 = xm;
            t_addr_local._4_4_ = iVar3;
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                       ,0xc0,"","ON_FindLocalMinimum() failed to converge");
            f_local._4_4_ = 2;
          }
          else {
            if (ok2 < 0) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                         ,0x6a,"","ON_FindLocalMinimum() f() failed to evaluate.");
            }
            *_ok1 = dVar1;
            f_local._4_4_ = (uint)(0 < ok2);
          }
        }
      }
    }
  }
  return f_local._4_4_;
}

Assistant:

int ON_FindLocalMinimum(
                int (*f)(void*,double,double*,double*), void* farg,
                double ax, double bx, double cx,
                double rel_stepsize_tol, double abs_stepsize_tol, int max_it, 
                double *t_addr
                )
/* Use Brent's algorithm (with derivative) to Find a (local) minimum of a function
 *
 * INPUT:
 *   ax, bx, cx a bracketed minimum satisfying conditions 1 and 2.
 *      1) either ax < bx < cx or cx < bx < ax.
 *      2) f(bx) < f(ax) and f(bx) < f(ax).
 *   farg
 *      pointer passed to function f()
 *   f
 *      evaluation function with prototype
 *              int f(void* farg,double t,double* ft,double* dft)
 *      f(farg,t,&ft,&dft) should compute ft = value of function at t
 *      and dft = value of derivative at t.
 *      -1: failure
 *       0: success
 *       1: |f(x)| is small enough - TL_NRdbrent() will return *t_addr = x
 *          and the return code 1.
 *   rel_stepsize_tol, abs_stepsize_tol  (0 < rel_stepsize_tol < 1 and 0 < abs_stepsize_tol)
 *      rel_stepsize_tol is a fractional tolerance and abs_stepsize_tol is an absolute tolerance
 *      that determine the minimum step size for a given iteration.
 *        minimum delta t = rel_stepsize_tol*|t| + abs_stepsize_tol.
 *      When in doubt, use 
 *         rel_stepsize_tol = ON_EPSILON 
 *         abs_stepsize_tol = 1/2*(desired absolute precision for *t_addr).
 *   max_it ( >= 2)
 *      maximum number of iterations to permit (when in doubt use 100)
 *      Closest Point to bezier minimizations typically take < 30
 *      iterations.
 *
 * OUTPUT:
 *   *t_addr abcissa of a local minimum between ax and cx.
 *       0: failure
 *       1: success
 *       2: After max_iteration_cnt iterations the tolerance restrictions
 *          where not satisfied.  Try increasing max_it, rel_stepsize_tol and/or abs_stepsize_tol
 *          or use the value of (*t_addr) with extreme caution.
 */
{
  // See Numerical Recipes in C's dbrent() for a description of the basic algorithm
  int rc,ok1,ok2;
  double a,b,d,d1,d2,du,dv,dw,dx,e,fu,fv,fw,fx,olde,tol1,tol2,u,u1,u2,v,w,x,xm;

  d=e=0.0;

  if ( 0 == t_addr )
  {
    ON_ERROR("t_addr is nullptr");
    return 0;
  }

  *t_addr = bx;

  if ( max_it < 2 )
  {
    ON_ERROR("max_it must be >= 2");
    return 0;
  }
  if ( !ON_IsValid(rel_stepsize_tol) || rel_stepsize_tol <= 0.0 || rel_stepsize_tol >= 1.0 )
  {
    ON_ERROR("rel_stepsize_tol must be strictly between 0.0 and 1.0");
    return 0;
  }
  if ( !ON_IsValid(abs_stepsize_tol) || abs_stepsize_tol <= 0.0 )
  {
    ON_ERROR("abs_stepsize_tol must be > 0");
    return 0;
  }

  a=(ax < cx ? ax : cx);
  b=(ax > cx ? ax : cx);
  x=w=v=bx;
  rc = f(farg,x,&fx,&dx);
  if (rc) {
     // f() returned nonzero return code which means we need to bailout
    if ( rc < 0 ) {
      ON_ERROR("ON_FindLocalMinimum() f() failed to evaluate.");
    }
    *t_addr = x;
    return rc>0 ? 1 : 0; // return 1 means f() said result is good enough, return = 0 means f() failed
  }
  fw=fv=fx;
  dw=dv=dx;
  while(max_it--) {
    xm=0.5*(a+b);
    tol1=rel_stepsize_tol*fabs(x)+abs_stepsize_tol;
    tol2=2.0*tol1;
    if (fabs(x-xm) <= (tol2-0.5*(b-a))) {
      // further adjustments to x are smaller than stepsize tolerance
      *t_addr=x;
      return 1;
    }
    if (fabs(e) > tol1) {
      d1=2.0*(b-a);
      d2=d1;
      if (dw != dx) d1=(w-x)*dx/(dx-dw);
      if (dv != dx) d2=(v-x)*dx/(dx-dv);
      u1=x+d1;
      u2=x+d2;
      ok1 = (a-u1)*(u1-b) > 0.0 && dx*d1 <= 0.0;
      ok2 = (a-u2)*(u2-b) > 0.0 && dx*d2 <= 0.0;
      olde=e;
      e=d;
      if (ok1 || ok2) {
        if (ok1 && ok2)
          d=(fabs(d1) < fabs(d2) ? d1 : d2);
        else if (ok1)
          d=d1;
        else
          d=d2;
        if (fabs(d) <= fabs(0.5*olde)) {
          u=x+d;
          if (u-a < tol2 || b-u < tol2)
            {d = (xm >= x) ? tol1 : -tol1;}
        } else {
          d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
        }
      } else {
        d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
      }
    } else {
      d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
    }
    if (fabs(d) >= tol1) {
      u=x+d;
      rc = f(farg,u,&fu,&du);
    }
    else {
      u = (d >= 0.0) ? x+tol1 : x-tol1;
      rc = f(farg,u,&fu,&du);
      if (rc >= 0 && fu > fx) {
        // tweaking x any more increases function value - x is a numerical minimum
        *t_addr=x;
        return 1;
      }
    }
    if (rc) {
      // f() returned nonzero return code which means we need to bailout
      if ( rc < 0 ) {
        ON_ERROR("ON_FindLocalMinimum() f() failed to evaluate.");
      }
      else {
        *t_addr = (fu < fx) ? u : x;
      }
      return rc>0 ? 1 : 0;
    }
    if (fu <= fx) {
      if (u >= x) a=x; else b=x;
      v=w;fv=fw;dv=dw;
      w=x;fw=fx;dw=dx;
      x=u;fx=fu;dx=du;
    } else {
      if (u < x) a=u; else b=u;
      if (fu <= fw || w == x) {
        v=w;fv=fw;dv=dw;
        w=u;fw=fu;dw=du;
      } else if (fu < fv || v == x || v == w) {
        v=u;fv=fu;dv=du;
      }
    }
  }
  *t_addr = x; // best known answer
  ON_ERROR("ON_FindLocalMinimum() failed to converge");
  return 2; // 2 means we failed to converge
}